

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O0

void tb_set_jmp_target_aarch64(TranslationBlock *tb,int n,uintptr_t addr)

{
  void *tc_ptr_00;
  uintptr_t tc_ptr;
  uintptr_t offset;
  uintptr_t addr_local;
  int n_local;
  TranslationBlock *tb_local;
  
  tc_ptr_00 = (tb->tc).ptr;
  tb_target_set_jmp_target_aarch64
            ((uintptr_t)tc_ptr_00,(long)tc_ptr_00 + tb->jmp_target_arg[n],addr);
  return;
}

Assistant:

void tb_set_jmp_target(TranslationBlock *tb, int n, uintptr_t addr)
{
    if (TCG_TARGET_HAS_direct_jump) {
        uintptr_t offset = tb->jmp_target_arg[n];
        uintptr_t tc_ptr = (uintptr_t)tb->tc.ptr;
        tb_target_set_jmp_target(tc_ptr, tc_ptr + offset, addr);
    } else {
        tb->jmp_target_arg[n] = addr;
    }
}